

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>::
loadFromIterator<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>::BottomFirstIterator>
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>> *this,
          BottomFirstIterator it)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  byte *pbVar4;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar5;
  byte bVar6;
  uint uVar7;
  uint local_48;
  undefined1 local_44;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 local_38;
  
  for (pMVar5 = it._pointer; pMVar5 != it._afterLast; pMVar5 = pMVar5 + 1) {
    local_44 = 0;
    local_38 = 0;
    local_40 = 0;
    uStack_3f = 0;
    bVar6 = *(byte *)&(pMVar5->term).super_PolyNfSuper._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            & 3;
    if (bVar6 == 0) {
      uVar7 = *(uint *)(pMVar5->term).super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content;
      uVar3 = *(undefined8 *)
               ((pMVar5->term).super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content + 8);
      local_40 = (undefined1)uVar3;
      uStack_3f = (undefined7)((ulong)uVar3 >> 8);
      local_48 = uVar7;
    }
    else if (bVar6 == 1) {
      uVar7 = *(uint *)(pMVar5->term).super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                       ._content;
      local_48 = uVar7;
    }
    else {
      local_40 = 0;
      pcVar1 = (pMVar5->term).super_PolyNfSuper._inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               ._content;
      uVar7 = (uint)(*pcVar1 & 3);
      uVar3 = *(undefined8 *)
               ((pMVar5->term).super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                ._content + 9);
      local_48 = *(uint *)pcVar1 & 0xffffff03;
      local_44 = (undefined1)
                 ((uint)*(undefined4 *)
                         ((pMVar5->term).super_PolyNfSuper._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content + 1) >> 0x18);
      uStack_3f = (undefined7)uVar3;
      local_38 = (undefined1)((ulong)uVar3 >> 0x38);
    }
    iVar2 = pMVar5->power;
    pbVar4 = *(byte **)(this + 0x10);
    if (pbVar4 == *(byte **)(this + 0x18)) {
      Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                 this);
      pbVar4 = *(byte **)(this + 0x10);
    }
    pbVar4[0] = 0;
    pbVar4[1] = 0;
    pbVar4[2] = 0;
    pbVar4[3] = 0;
    pbVar4[4] = 0;
    pbVar4[5] = 0;
    pbVar4[6] = 0;
    pbVar4[7] = 0;
    pbVar4[8] = 0;
    pbVar4[9] = 0;
    pbVar4[10] = 0;
    pbVar4[0xb] = 0;
    pbVar4[0xc] = 0;
    pbVar4[0xd] = 0;
    pbVar4[0xe] = 0;
    pbVar4[0xf] = 0;
    pbVar4[0x10] = 0;
    pbVar4[0x11] = 0;
    pbVar4[0x12] = 0;
    pbVar4[0x13] = 0;
    pbVar4[0x14] = 0;
    pbVar4[0x15] = 0;
    pbVar4[0x16] = 0;
    pbVar4[0x17] = 0;
    *pbVar4 = bVar6;
    if (bVar6 == 0) {
      *(uint *)(pbVar4 + 1) = local_48;
      *(ulong *)(pbVar4 + 9) = CONCAT71(uStack_3f,local_40);
    }
    else if (bVar6 == 1) {
      *(uint *)(pbVar4 + 1) = local_48;
    }
    else {
      pbVar4[5] = 0;
      pbVar4[6] = 0;
      pbVar4[7] = 0;
      pbVar4[8] = 0;
      pbVar4[9] = 0;
      pbVar4[10] = 0;
      pbVar4[0xb] = 0;
      pbVar4[0xc] = 0;
      pbVar4[0xd] = 0;
      pbVar4[0xe] = 0;
      pbVar4[0xf] = 0;
      pbVar4[0x10] = 0;
      pbVar4[0x11] = 0;
      pbVar4[0x12] = 0;
      pbVar4[0x13] = 0;
      pbVar4[0x14] = 0;
      pbVar4[1] = (byte)uVar7 & 3;
      *(uint *)(pbVar4 + 2) = CONCAT13(local_44,local_48._1_3_);
      *(ulong *)(pbVar4 + 10) = CONCAT17(local_38,uStack_3f);
    }
    *(int *)(pbVar4 + 0x18) = iVar2;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 0x1c;
  }
  return;
}

Assistant:

inline
    bool hasNext() const
    {
      ASS_LE(_pointer, _afterLast);
      return _pointer != _afterLast;
    }